

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linux-inotify.c
# Opt level: O3

void maybe_free_watcher_list(watcher_list *w,uv_loop_t *loop)

{
  int iVar1;
  undefined4 uVar2;
  void **ppvVar3;
  watcher_list *pwVar4;
  watcher_list *pwVar5;
  watcher_list *pwVar6;
  watcher_list *old;
  int iVar7;
  watcher_list *pwVar8;
  void **ppvVar9;
  watcher_list *pwVar10;
  watcher_list *pwVar11;
  
  if ((w->iterating != 0) || (w->watchers != (void **)w->watchers[0])) {
    return;
  }
  ppvVar3 = &loop->inotify_watchers;
  pwVar8 = (w->entry).rbe_left;
  pwVar4 = (w->entry).rbe_right;
  if (pwVar8 == (watcher_list *)0x0) {
    pwVar5 = (w->entry).rbe_parent;
    iVar7 = (w->entry).rbe_color;
    if (pwVar4 != (watcher_list *)0x0) goto LAB_00246b95;
    pwVar4 = (watcher_list *)0x0;
LAB_00246b9d:
    ppvVar9 = ppvVar3;
    if (pwVar5 != (watcher_list *)0x0) {
      ppvVar9 = pwVar5->watchers + ((ulong)((pwVar5->entry).rbe_left != w) - 4);
    }
    *ppvVar9 = pwVar4;
  }
  else {
    if (pwVar4 == (watcher_list *)0x0) {
      pwVar5 = (w->entry).rbe_parent;
      iVar7 = (w->entry).rbe_color;
      pwVar4 = pwVar8;
LAB_00246b95:
      (pwVar4->entry).rbe_parent = pwVar5;
      goto LAB_00246b9d;
    }
    do {
      pwVar8 = pwVar4;
      pwVar4 = (pwVar8->entry).rbe_left;
    } while (pwVar4 != (watcher_list *)0x0);
    pwVar4 = (pwVar8->entry).rbe_right;
    pwVar5 = (pwVar8->entry).rbe_parent;
    iVar7 = (pwVar8->entry).rbe_color;
    if (pwVar4 != (watcher_list *)0x0) {
      (pwVar4->entry).rbe_parent = pwVar5;
    }
    ppvVar9 = ppvVar3;
    if (pwVar5 != (watcher_list *)0x0) {
      ppvVar9 = pwVar5->watchers + ((ulong)((pwVar5->entry).rbe_left != pwVar8) - 4);
    }
    *ppvVar9 = pwVar4;
    if ((pwVar8->entry).rbe_parent == w) {
      pwVar5 = pwVar8;
    }
    pwVar11 = (w->entry).rbe_left;
    pwVar6 = (w->entry).rbe_right;
    iVar1 = (w->entry).rbe_color;
    uVar2 = *(undefined4 *)&(w->entry).field_0x1c;
    (pwVar8->entry).rbe_parent = (w->entry).rbe_parent;
    (pwVar8->entry).rbe_color = iVar1;
    *(undefined4 *)&(pwVar8->entry).field_0x1c = uVar2;
    (pwVar8->entry).rbe_left = pwVar11;
    (pwVar8->entry).rbe_right = pwVar6;
    pwVar11 = (w->entry).rbe_parent;
    ppvVar9 = ppvVar3;
    if (pwVar11 != (watcher_list *)0x0) {
      ppvVar9 = pwVar11->watchers + ((ulong)((pwVar11->entry).rbe_left != w) - 4);
    }
    *ppvVar9 = pwVar8;
    (((w->entry).rbe_left)->entry).rbe_parent = pwVar8;
    pwVar11 = (w->entry).rbe_right;
    if (pwVar11 != (watcher_list *)0x0) {
      (pwVar11->entry).rbe_parent = pwVar8;
    }
  }
  if (iVar7 == 0) {
    do {
      if ((pwVar4 != (watcher_list *)0x0) && ((pwVar4->entry).rbe_color != 0)) goto LAB_00246e9f;
      pwVar8 = (watcher_list *)*ppvVar3;
      if (pwVar4 == pwVar8) goto LAB_00246e9a;
      pwVar11 = (pwVar5->entry).rbe_left;
      if (pwVar11 == pwVar4) {
        pwVar4 = (pwVar5->entry).rbe_right;
        pwVar6 = pwVar4;
        if ((pwVar4->entry).rbe_color == 1) {
          (pwVar4->entry).rbe_color = 0;
          (pwVar5->entry).rbe_color = 1;
          pwVar6 = (pwVar4->entry).rbe_left;
          (pwVar5->entry).rbe_right = pwVar6;
          if (pwVar6 != (watcher_list *)0x0) {
            (pwVar6->entry).rbe_parent = pwVar5;
          }
          pwVar11 = (pwVar5->entry).rbe_parent;
          (pwVar4->entry).rbe_parent = pwVar11;
          if (pwVar11 == (watcher_list *)0x0) {
            *ppvVar3 = pwVar4;
            pwVar8 = pwVar4;
          }
          else if (pwVar5 == (pwVar11->entry).rbe_left) {
            (pwVar11->entry).rbe_left = pwVar4;
          }
          else {
            (pwVar11->entry).rbe_right = pwVar4;
            pwVar6 = (pwVar5->entry).rbe_right;
          }
          (pwVar4->entry).rbe_left = pwVar5;
          (pwVar5->entry).rbe_parent = pwVar4;
        }
        pwVar4 = (pwVar6->entry).rbe_left;
        if ((pwVar4 != (watcher_list *)0x0) && ((pwVar4->entry).rbe_color != 0)) {
          pwVar11 = (pwVar6->entry).rbe_right;
          if ((pwVar11 == (watcher_list *)0x0) || ((pwVar11->entry).rbe_color == 0)) {
            (pwVar4->entry).rbe_color = 0;
            (pwVar6->entry).rbe_color = 1;
            pwVar11 = (pwVar4->entry).rbe_right;
            (pwVar6->entry).rbe_left = pwVar11;
            if (pwVar11 != (watcher_list *)0x0) {
              (pwVar11->entry).rbe_parent = pwVar6;
            }
            pwVar11 = (pwVar6->entry).rbe_parent;
            (pwVar4->entry).rbe_parent = pwVar11;
            pwVar10 = pwVar4;
            ppvVar9 = ppvVar3;
            if (pwVar11 != (watcher_list *)0x0) {
              ppvVar9 = pwVar11->watchers + ((ulong)(pwVar6 != (pwVar11->entry).rbe_left) - 4);
              pwVar10 = pwVar8;
            }
            *ppvVar9 = pwVar4;
            (pwVar4->entry).rbe_right = pwVar6;
            (pwVar6->entry).rbe_parent = pwVar4;
            pwVar6 = (pwVar5->entry).rbe_right;
            pwVar11 = (pwVar6->entry).rbe_right;
            (pwVar6->entry).rbe_color = (pwVar5->entry).rbe_color;
            (pwVar5->entry).rbe_color = 0;
            if (pwVar11 != (watcher_list *)0x0) goto LAB_00246e59;
          }
          else {
LAB_00246d32:
            (pwVar6->entry).rbe_color = (pwVar5->entry).rbe_color;
            (pwVar5->entry).rbe_color = 0;
            pwVar10 = pwVar8;
LAB_00246e59:
            (pwVar11->entry).rbe_color = 0;
          }
          pwVar8 = (pwVar6->entry).rbe_left;
          (pwVar5->entry).rbe_right = pwVar8;
          if (pwVar8 != (watcher_list *)0x0) {
            (pwVar8->entry).rbe_parent = pwVar5;
          }
          pwVar8 = (pwVar5->entry).rbe_parent;
          (pwVar6->entry).rbe_parent = pwVar8;
          pwVar4 = pwVar6;
          if (pwVar8 != (watcher_list *)0x0) {
            ppvVar3 = pwVar8->watchers + ((ulong)(pwVar5 != (pwVar8->entry).rbe_left) - 4);
            pwVar4 = pwVar10;
          }
          *ppvVar3 = pwVar6;
          (pwVar6->entry).rbe_left = pwVar5;
          goto LAB_00246e96;
        }
        pwVar11 = (pwVar6->entry).rbe_right;
        if ((pwVar11 != (watcher_list *)0x0) && ((pwVar11->entry).rbe_color != 0))
        goto LAB_00246d32;
      }
      else {
        pwVar6 = pwVar11;
        if ((pwVar11->entry).rbe_color == 1) {
          (pwVar11->entry).rbe_color = 0;
          (pwVar5->entry).rbe_color = 1;
          pwVar6 = (pwVar11->entry).rbe_right;
          (pwVar5->entry).rbe_left = pwVar6;
          if (pwVar6 != (watcher_list *)0x0) {
            (pwVar6->entry).rbe_parent = pwVar5;
          }
          pwVar4 = (pwVar5->entry).rbe_parent;
          (pwVar11->entry).rbe_parent = pwVar4;
          if (pwVar4 == (watcher_list *)0x0) {
            *ppvVar3 = pwVar11;
            pwVar8 = pwVar11;
          }
          else if (pwVar5 == (pwVar4->entry).rbe_left) {
            (pwVar4->entry).rbe_left = pwVar11;
            pwVar6 = (pwVar5->entry).rbe_left;
          }
          else {
            (pwVar4->entry).rbe_right = pwVar11;
          }
          (pwVar11->entry).rbe_right = pwVar5;
          (pwVar5->entry).rbe_parent = pwVar11;
        }
        pwVar4 = (pwVar6->entry).rbe_left;
        if ((pwVar4 != (watcher_list *)0x0) && ((pwVar4->entry).rbe_color != 0)) goto LAB_00246d03;
        pwVar11 = (pwVar6->entry).rbe_right;
        if ((pwVar11 != (watcher_list *)0x0) && ((pwVar11->entry).rbe_color != 0))
        goto LAB_00246cf7;
      }
      (pwVar6->entry).rbe_color = 1;
      pwVar4 = pwVar5;
      pwVar5 = (pwVar5->entry).rbe_parent;
    } while( true );
  }
  goto LAB_00246ea7;
LAB_00246cf7:
  if ((pwVar4 == (watcher_list *)0x0) || ((pwVar4->entry).rbe_color == 0)) {
    (pwVar11->entry).rbe_color = 0;
    (pwVar6->entry).rbe_color = 1;
    pwVar4 = (pwVar11->entry).rbe_left;
    (pwVar6->entry).rbe_right = pwVar4;
    if (pwVar4 != (watcher_list *)0x0) {
      (pwVar4->entry).rbe_parent = pwVar6;
    }
    pwVar4 = (pwVar6->entry).rbe_parent;
    (pwVar11->entry).rbe_parent = pwVar4;
    pwVar10 = pwVar11;
    ppvVar9 = ppvVar3;
    if (pwVar4 != (watcher_list *)0x0) {
      ppvVar9 = pwVar4->watchers + ((ulong)(pwVar6 != (pwVar4->entry).rbe_left) - 4);
      pwVar10 = pwVar8;
    }
    *ppvVar9 = pwVar11;
    (pwVar11->entry).rbe_left = pwVar6;
    (pwVar6->entry).rbe_parent = pwVar11;
    pwVar6 = (pwVar5->entry).rbe_left;
    pwVar4 = (pwVar6->entry).rbe_left;
    (pwVar6->entry).rbe_color = (pwVar5->entry).rbe_color;
    (pwVar5->entry).rbe_color = 0;
    if (pwVar4 != (watcher_list *)0x0) goto LAB_00246dae;
  }
  else {
LAB_00246d03:
    (pwVar6->entry).rbe_color = (pwVar5->entry).rbe_color;
    (pwVar5->entry).rbe_color = 0;
    pwVar10 = pwVar8;
LAB_00246dae:
    (pwVar4->entry).rbe_color = 0;
  }
  pwVar8 = (pwVar6->entry).rbe_right;
  (pwVar5->entry).rbe_left = pwVar8;
  if (pwVar8 != (watcher_list *)0x0) {
    (pwVar8->entry).rbe_parent = pwVar5;
  }
  pwVar8 = (pwVar5->entry).rbe_parent;
  (pwVar6->entry).rbe_parent = pwVar8;
  pwVar4 = pwVar6;
  if (pwVar8 != (watcher_list *)0x0) {
    ppvVar3 = pwVar8->watchers + ((ulong)(pwVar5 != (pwVar8->entry).rbe_left) - 4);
    pwVar4 = pwVar10;
  }
  *ppvVar3 = pwVar6;
  (pwVar6->entry).rbe_right = pwVar5;
LAB_00246e96:
  (pwVar5->entry).rbe_parent = pwVar6;
LAB_00246e9a:
  if (pwVar4 != (watcher_list *)0x0) {
LAB_00246e9f:
    (pwVar4->entry).rbe_color = 0;
  }
LAB_00246ea7:
  inotify_rm_watch(loop->inotify_fd,w->wd);
  uv__free(w);
  return;
}

Assistant:

static void maybe_free_watcher_list(struct watcher_list* w, uv_loop_t* loop) {
  /* if the watcher_list->watchers is being iterated over, we can't free it. */
  if ((!w->iterating) && QUEUE_EMPTY(&w->watchers)) {
    /* No watchers left for this path. Clean up. */
    RB_REMOVE(watcher_root, CAST(&loop->inotify_watchers), w);
    inotify_rm_watch(loop->inotify_fd, w->wd);
    uv__free(w);
  }
}